

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

int __thiscall
ON_Matrix::RowReduce
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int pt_stride,double *pt,double *pivot)

{
  uint uVar1;
  double **ppdVar2;
  uint uVar3;
  double dVar4;
  void *memblock;
  ulong uVar5;
  double *pdVar6;
  double ***pppdVar7;
  size_t __n;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  ulong local_88;
  double local_78;
  double *local_68;
  uint local_60;
  
  memblock = onmalloc((long)pt_dim * 8);
  uVar1 = this->m_row_count;
  pppdVar7 = &(this->m_rowmem).m_a;
  if (uVar1 != (this->m_rowmem).m_count) {
    pppdVar7 = &this->m;
  }
  uVar3 = this->m_col_count;
  if ((int)uVar1 < this->m_col_count) {
    uVar3 = uVar1;
  }
  ppdVar2 = *pppdVar7;
  __n = ((long)pt_dim << 0x23) >> 0x20;
  uVar15 = 0;
  uVar11 = (ulong)(uint)pt_dim;
  if (pt_dim < 1) {
    uVar11 = uVar15;
  }
  lVar8 = (long)pt_stride;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = uVar15;
  }
  local_78 = 0.0;
  uVar14 = 1;
  local_68 = pt;
  while (local_88 = uVar5, uVar15 != uVar5) {
    lVar10 = (long)(int)uVar14;
    pdVar12 = (double *)(lVar8 * 8 * lVar10 + (long)pt);
    onmalloc(0);
    pdVar6 = ppdVar2[uVar15];
    dVar16 = pdVar6[uVar15];
    dVar17 = ABS(dVar16);
    local_60 = (uint)uVar15;
    uVar13 = uVar15 & 0xffffffff;
    for (uVar9 = uVar14; (int)uVar9 < this->m_row_count; uVar9 = uVar9 + 1) {
      if (dVar17 < ABS(ppdVar2[uVar9][uVar15])) {
        uVar13 = uVar9 & 0xffffffff;
        dVar17 = ABS(ppdVar2[uVar9][uVar15]);
      }
    }
    dVar4 = dVar17;
    if ((uVar15 != 0) && (local_78 <= dVar17)) {
      dVar4 = local_78;
    }
    local_78 = dVar4;
    local_88 = uVar15;
    if (dVar17 <= zero_tolerance) break;
    if (uVar15 != uVar13) {
      SwapRows(this,(int)uVar13,local_60);
      memcpy(memblock,pt + pt_stride * (int)uVar13,__n);
      memcpy(pt + pt_stride * (int)uVar13,pt + uVar15 * lVar8,__n);
      memcpy(pt + uVar15 * lVar8,memblock,__n);
      pdVar6 = ppdVar2[uVar15];
      dVar16 = pdVar6[uVar15];
    }
    uVar13 = uVar15 + 1;
    dVar16 = 1.0 / dVar16;
    if ((dVar16 != 1.0) || (NAN(dVar16))) {
      pdVar6[uVar15] = 1.0;
      ON_ArrayScale(this->m_col_count + ~local_60,dVar16,pdVar6 + uVar13,pdVar6 + uVar13);
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        local_68[uVar9] = local_68[uVar9] * dVar16;
      }
    }
    local_60 = ~local_60;
    for (; lVar10 < this->m_row_count; lVar10 = lVar10 + 1) {
      pdVar6 = ppdVar2[lVar10];
      dVar16 = pdVar6[uVar15];
      pdVar6[uVar15] = 0.0;
      if (zero_tolerance < ABS(dVar16)) {
        dVar16 = -dVar16;
        ON_Array_aA_plus_B(this->m_col_count + local_60,dVar16,ppdVar2[uVar15] + uVar13,
                           pdVar6 + uVar13,pdVar6 + uVar13);
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          pdVar12[uVar9] = pt[uVar15 * lVar8 + uVar9] * dVar16 + pdVar12[uVar9];
        }
      }
      pdVar12 = pdVar12 + lVar8;
    }
    uVar14 = uVar14 + 1;
    local_68 = local_68 + lVar8;
    uVar15 = uVar13;
  }
  if (pivot != (double *)0x0) {
    *pivot = local_78;
  }
  onfree(memblock);
  return (int)local_88;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    int pt_dim, int pt_stride, double* pt,
    double* pivot 
    )
{
  const int sizeof_pt = pt_dim*sizeof(pt[0]);
  double* tmp_pt = (double*)onmalloc(pt_dim*sizeof(tmp_pt[0]));
  double *ptA, *ptB;
  double x, piv;
  int i, k, ix, rank, pti;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
//    onfree( onmalloc( 1)); //  8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    // swap rows of matrix and B
    if ( ix != k ) {
      SwapRows( ix, k );
      ptA = pt + (ix*pt_stride);
      ptB = pt + (k*pt_stride);
      memcpy( tmp_pt, ptA, sizeof_pt );
      memcpy( ptA, ptB, sizeof_pt );
      memcpy( ptB, tmp_pt, sizeof_pt );
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    if ( x != 1.0 ) {
      this_m[k][k] = 1.0;
      ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
      ptA = pt + (k*pt_stride);
      for ( pti = 0; pti < pt_dim; pti++ )
        ptA[pti] *= x;
    }

    // zero column k for rows below this_m[k][k]
    ptB = pt + (k*pt_stride);
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        ptA = pt + (i*pt_stride);
        for ( pti = 0; pti < pt_dim; pti++ ) {
          ptA[pti] += x*ptB[pti];
        }
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  onfree(tmp_pt);

  return rank;
}